

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_leadingNumbers.cpp
# Opt level: O0

void __thiscall
numericalWords_compound_Test::~numericalWords_compound_Test(numericalWords_compound_Test *this)

{
  numericalWords_compound_Test *this_local;
  
  ~numericalWords_compound_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(numericalWords, compound)
{
    size_t index = 0U;
    std::string tword = "hundredthousandm";
    auto res = testNumericalWords(tword, index);
    EXPECT_EQ(res, 1e5);
    EXPECT_EQ(tword[index], 'm');
    res = testNumericalWords("hundredmillion", index);
    EXPECT_EQ(res, 1e8);
    EXPECT_EQ(index, 14U);
    res = testNumericalWords("fourhundredmillion", index);
    EXPECT_EQ(res, 4e8);
    EXPECT_EQ(index, 18U);
    res = testNumericalWords("twohundredthousandfourhundred", index);
    EXPECT_EQ(res, 200400);
}